

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_test.c
# Opt level: O0

void test_case_signed_add(zt_unit_test *test,void *data)

{
  char cVar1;
  short sVar2;
  int iVar3;
  zt_unit_test *in_RDI;
  char *msg_17;
  char *msg_16;
  char *msg_15;
  char *msg_14;
  char *msg_13;
  char *msg_12;
  char *msg_11;
  char *msg_10;
  char *msg_9;
  char *msg_8;
  char *msg_7;
  char *msg_6;
  char *msg_5;
  char *msg_4;
  char *msg_3;
  char *msg_2;
  char *msg_1;
  char *msg;
  
  cVar1 = zt_char_add(-0x80,'\x01');
  if (cVar1 != -0x7f) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_char_add(CHAR_MIN, 1) == CHAR_MIN + 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x15);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  cVar1 = zt_char_add('\x01',-0x80);
  if (cVar1 != -0x7f) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_char_add(1, CHAR_MIN) == CHAR_MIN + 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x16);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  cVar1 = zt_char_add('\x7f',-1);
  if (cVar1 != '~') {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_char_add(CHAR_MAX, -1) == CHAR_MAX - 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x17);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  cVar1 = zt_char_add(-1,'\x7f');
  if (cVar1 != '~') {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_char_add(-1, CHAR_MAX) == CHAR_MAX - 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x18);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  cVar1 = zt_char_add('?','\x01');
  if (cVar1 != '@') {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_char_add(CHAR_MAX / 2, 1) == CHAR_MAX / 2 + 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1a);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  cVar1 = zt_char_add('\x01','?');
  if (cVar1 != '@') {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_char_add(1, CHAR_MAX / 2) == CHAR_MAX / 2 + 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1b);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_add(-0x8000,1);
  if (sVar2 != -0x7fff) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_short_add(SHORT_MIN, 1) == SHORT_MIN + 1"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x27);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_add(1,-0x8000);
  if (sVar2 != -0x7fff) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_short_add(1, SHORT_MIN) == SHORT_MIN + 1"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x28);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_add(0x7fff,-1);
  if (sVar2 != 0x7ffe) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_short_add(SHORT_MAX, -1) == SHORT_MAX - 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x29);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_add(-1,0x7fff);
  if (sVar2 != 0x7ffe) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_short_add(-1, SHORT_MAX) == SHORT_MAX - 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x2a);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_add(0x3fff,1);
  if (sVar2 != 0x4000) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_short_add(SHORT_MAX / 2, 1) == SHORT_MAX / 2 + 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x2c);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_add(1,0x3fff);
  if (sVar2 != 0x4000) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_short_add(1, SHORT_MAX / 2) == SHORT_MAX / 2 + 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x2d);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  iVar3 = zt_int_add(-0x80000000,1);
  if (iVar3 != -0x7fffffff) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_int_add(INT_MIN, 1) == INT_MIN + 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x38);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  iVar3 = zt_int_add(1,-0x80000000);
  if (iVar3 != -0x7fffffff) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_int_add(1, INT_MIN) == INT_MIN + 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x39);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  iVar3 = zt_int_add(0x7fffffff,-1);
  if (iVar3 != 0x7ffffffe) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_int_add(INT_MAX, -1) == INT_MAX - 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x3a);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  iVar3 = zt_int_add(-1,0x7fffffff);
  if (iVar3 == 0x7ffffffe) {
    zt_unit_test_add_assertion(in_RDI);
    iVar3 = zt_int_add(0x3fffffff,1);
    if (iVar3 != 0x40000000) {
      iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                             "zt_int_add(INT_MAX / 2, 1) == INT_MAX / 2 + 1",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                             ,0x3d);
      if (iVar3 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    iVar3 = zt_int_add(1,0x3fffffff);
    if (iVar3 == 0x40000000) {
      zt_unit_test_add_assertion(in_RDI);
      return;
    }
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_int_add(1, INT_MAX / 2) == INT_MAX / 2 + 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x3e);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_int_add(-1, INT_MAX) == INT_MAX - 1",
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                         ,0x3b);
  if (iVar3 == 0) {
    in_RDI->error = (char *)0x0;
  }
  longjmp((__jmp_buf_tag *)in_RDI->env,1);
}

Assistant:

static void
test_case_signed_add(struct zt_unit_test *test, void *data UNUSED)
{
    /* CHAR pos common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_char_add(CHAR_MAX, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_char_add(1, CHAR_MAX)); */

    /* CHAR neg common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_char_add(CHAR_MIN, -1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_char_add(-1, CHAR_MIN)); */

    /* CHAR limits */
    ZT_UNIT_ASSERT(test, zt_char_add(CHAR_MIN, 1) == CHAR_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_char_add(1, CHAR_MIN) == CHAR_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_char_add(CHAR_MAX, -1) == CHAR_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_char_add(-1, CHAR_MAX) == CHAR_MAX - 1);
    /* CHAR middle */
    ZT_UNIT_ASSERT(test, zt_char_add(CHAR_MAX / 2, 1) == CHAR_MAX / 2 + 1);
    ZT_UNIT_ASSERT(test, zt_char_add(1, CHAR_MAX / 2) == CHAR_MAX / 2 + 1);


    /* SHORT pos common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_short_add(SHORT_MAX, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_short_add(1, SHORT_MAX)); */

    /* SHORT neg common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_short_add(SHORT_MIN, -1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_short_add(-1, SHORT_MIN)); */

    /* SHORT limits */
    ZT_UNIT_ASSERT(test, zt_short_add(SHORT_MIN, 1) == SHORT_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_short_add(1, SHORT_MIN) == SHORT_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_short_add(SHORT_MAX, -1) == SHORT_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_short_add(-1, SHORT_MAX) == SHORT_MAX - 1);
    /* SHORT middle */
    ZT_UNIT_ASSERT(test, zt_short_add(SHORT_MAX / 2, 1) == SHORT_MAX / 2 + 1);
    ZT_UNIT_ASSERT(test, zt_short_add(1, SHORT_MAX / 2) == SHORT_MAX / 2 + 1);

    /* INT pos common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_int_add(INT_MAX, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_int_add(1, INT_MAX)); */

    /* INT neg common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_int_add(INT_MIN, -1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_int_add(-1, INT_MIN)); */

    /* INT limits */
    ZT_UNIT_ASSERT(test, zt_int_add(INT_MIN, 1) == INT_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_int_add(1, INT_MIN) == INT_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_int_add(INT_MAX, -1) == INT_MAX - 1);
    ZT_UNIT_ASSERT(test, zt_int_add(-1, INT_MAX) == INT_MAX - 1);
    /* INT middle */
    ZT_UNIT_ASSERT(test, zt_int_add(INT_MAX / 2, 1) == INT_MAX / 2 + 1);
    ZT_UNIT_ASSERT(test, zt_int_add(1, INT_MAX / 2) == INT_MAX / 2 + 1);

# ifndef __x86_64__
    /* LONG pos common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_long_add(LONG_MAX, 0L)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_long_add(1L, LONG_MAX)); */
    /* LONG neg common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_long_add(LONG_MIN, -1L)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_long_add(-1L, LONG_MIN)); */
    /* LONG limits */
    ZT_UNIT_ASSERT(test, zt_long_add(LONG_MIN, 1L) == LONG_MIN + 1L);
    ZT_UNIT_ASSERT(test, zt_long_add(1L, LONG_MIN) == LONG_MIN + 1L);
    ZT_UNIT_ASSERT(test, zt_long_add(LONG_MAX, -1L) == LONG_MAX - 1L);
    ZT_UNIT_ASSERT(test, zt_long_add(-1L, LONG_MAX) == LONG_MAX - 1L);
    /* LONG middle */
    ZT_UNIT_ASSERT(test, zt_long_add(LONG_MAX / 2, 1) == LONG_MAX / 2 + 1);
    ZT_UNIT_ASSERT(test, zt_long_add(1, LONG_MAX / 2) == LONG_MAX / 2 + 1);
# endif /* ifndef __x86_64__ */
}